

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::ClientImpl::read_response_line(ClientImpl *this,Stream *strm,Request *req,Response *res)

{
  array<char,_2048UL> *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  pointer fixed_buffer;
  FILE *pFVar4;
  ulong uVar5;
  char *pcVar6;
  const_reference pvVar7;
  size_t *__n;
  size_t *extraout_RDX;
  size_t *__n_00;
  size_t *__n_01;
  size_t *extraout_RDX_00;
  string_type *__lineptr;
  string_type local_960;
  string_type local_940;
  string_type local_920;
  string_type local_900;
  string_type local_8e0;
  string_type local_8c0;
  undefined1 local_8a0 [8];
  cmatch m;
  undefined1 local_870 [8];
  stream_line_reader line_reader;
  array<char,_2048UL> buf;
  Response *res_local;
  Request *req_local;
  Stream *strm_local;
  ClientImpl *this_local;
  
  this_00 = (array<char,_2048UL> *)((long)&line_reader.glowable_buffer_.field_2 + 8);
  fixed_buffer = std::array<char,_2048UL>::data(this_00);
  pFVar4 = (FILE *)std::array<char,_2048UL>::size(this_00);
  detail::stream_line_reader::stream_line_reader
            ((stream_line_reader *)local_870,strm,fixed_buffer,(size_t)pFVar4);
  uVar5 = detail::stream_line_reader::getline
                    ((stream_line_reader *)local_870,(char **)strm,__n,pFVar4);
  if ((uVar5 & 1) == 0) {
    this_local._7_1_ = false;
    m._M_begin._0_4_ = 1;
  }
  else {
    if (read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)::
        re_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                                   ::re_abi_cxx11_);
      if (iVar2 != 0) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                    ::re_abi_cxx11_,"(HTTP/1\\.[01]) (\\d{3}) (.*?)\r\n",0x10);
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     &read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                      ::re_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                             ::re_abi_cxx11_);
      }
    }
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
    match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)local_8a0);
    pcVar6 = detail::stream_line_reader::ptr((stream_line_reader *)local_870);
    bVar1 = std::
            regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
                      (pcVar6,(match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               *)local_8a0,
                       &read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                        ::re_abi_cxx11_,0);
    if (bVar1) {
      pvVar7 = std::__cxx11::
               match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             *)local_8a0,1);
      std::__cxx11::sub_match::operator_cast_to_string(&local_8c0,(sub_match *)pvVar7);
      std::__cxx11::string::operator=((string *)res,(string *)&local_8c0);
      std::__cxx11::string::~string((string *)&local_8c0);
      pvVar7 = std::__cxx11::
               match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             *)local_8a0,2);
      std::__cxx11::sub_match::operator_cast_to_string(&local_8e0,(sub_match *)pvVar7);
      uVar3 = std::__cxx11::stoi(&local_8e0,(size_t *)0x0,10);
      pFVar4 = (FILE *)(ulong)uVar3;
      res->status = uVar3;
      std::__cxx11::string::~string((string *)&local_8e0);
      pvVar7 = std::__cxx11::
               match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             *)local_8a0,3);
      std::__cxx11::sub_match::operator_cast_to_string(&local_900,(sub_match *)pvVar7);
      __lineptr = &local_900;
      std::__cxx11::string::operator=((string *)&res->reason,(string *)__lineptr);
      std::__cxx11::string::~string((string *)&local_900);
      __n_00 = extraout_RDX;
      while (res->status == 100) {
        uVar5 = detail::stream_line_reader::getline
                          ((stream_line_reader *)local_870,(char **)__lineptr,__n_00,pFVar4);
        if ((uVar5 & 1) == 0) {
          this_local._7_1_ = false;
          goto LAB_00123ea3;
        }
        uVar5 = detail::stream_line_reader::getline
                          ((stream_line_reader *)local_870,(char **)__lineptr,__n_01,pFVar4);
        if ((uVar5 & 1) == 0) {
          this_local._7_1_ = false;
          goto LAB_00123ea3;
        }
        pcVar6 = detail::stream_line_reader::ptr((stream_line_reader *)local_870);
        bVar1 = std::
                regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
                          (pcVar6,(match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                   *)local_8a0,
                           &read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                            ::re_abi_cxx11_,0);
        if (!bVar1) {
          this_local._7_1_ = false;
          goto LAB_00123ea3;
        }
        pvVar7 = std::__cxx11::
                 match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               *)local_8a0,1);
        std::__cxx11::sub_match::operator_cast_to_string(&local_920,(sub_match *)pvVar7);
        std::__cxx11::string::operator=((string *)res,(string *)&local_920);
        std::__cxx11::string::~string((string *)&local_920);
        pvVar7 = std::__cxx11::
                 match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               *)local_8a0,2);
        std::__cxx11::sub_match::operator_cast_to_string(&local_940,(sub_match *)pvVar7);
        uVar3 = std::__cxx11::stoi(&local_940,(size_t *)0x0,10);
        pFVar4 = (FILE *)(ulong)uVar3;
        res->status = uVar3;
        std::__cxx11::string::~string((string *)&local_940);
        pvVar7 = std::__cxx11::
                 match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               *)local_8a0,3);
        std::__cxx11::sub_match::operator_cast_to_string(&local_960,(sub_match *)pvVar7);
        __lineptr = &local_960;
        std::__cxx11::string::operator=((string *)&res->reason,(string *)__lineptr);
        std::__cxx11::string::~string((string *)&local_960);
        __n_00 = extraout_RDX_00;
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = std::operator==(&req->method,"CONNECT");
    }
LAB_00123ea3:
    m._M_begin._0_4_ = 1;
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
    ~match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    *)local_8a0);
  }
  detail::stream_line_reader::~stream_line_reader((stream_line_reader *)local_870);
  return this_local._7_1_;
}

Assistant:

inline bool ClientImpl::read_response_line(Stream &strm, const Request &req,
											   Response &res) {
		std::array<char, 2048> buf;

		detail::stream_line_reader line_reader(strm, buf.data(), buf.size());

		if (!line_reader.getline()) { return false; }

		const static std::regex re("(HTTP/1\\.[01]) (\\d{3}) (.*?)\r\n");

		std::cmatch m;
		if (!std::regex_match(line_reader.ptr(), m, re)) {
			return req.method == "CONNECT";
		}
		res.version = std::string(m[1]);
		res.status = std::stoi(std::string(m[2]));
		res.reason = std::string(m[3]);

		// Ignore '100 Continue'
		while (res.status == 100) {
			if (!line_reader.getline()) { return false; } // CRLF
			if (!line_reader.getline()) { return false; } // next response line

			if (!std::regex_match(line_reader.ptr(), m, re)) { return false; }
			res.version = std::string(m[1]);
			res.status = std::stoi(std::string(m[2]));
			res.reason = std::string(m[3]);
		}

		return true;
	}